

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O2

void __thiscall Bracket::Bracket(Bracket *this,string *str,unsigned_long *pos)

{
  list<Atom_*,_std::allocator<Atom_*>_> *this_00;
  byte bVar1;
  Bracket *this_01;
  Symbol *this_02;
  Symbol *local_58;
  string local_50;
  
  (this->super_Atom)._vptr_Atom = (_func_int **)&PTR__Bracket_00108c40;
  (this->func)._M_dataplus._M_p = (pointer)&(this->func).field_2;
  (this->func)._M_string_length = 0;
  (this->func).field_2._M_local_buf[0] = '\0';
  this_00 = &this->para;
  (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node._M_size = 0;
  if ((str->_M_dataplus)._M_p[*pos] == '(') {
    *pos = *pos + 1;
    getWord(&local_50,str,pos);
    std::__cxx11::string::operator=((string *)&this->func,(string *)&local_50);
    while( true ) {
      std::__cxx11::string::~string((string *)&local_50);
      while( true ) {
        while( true ) {
          bVar1 = (str->_M_dataplus)._M_p[*pos];
          if ((1 < bVar1 - 9) && (bVar1 != 0x20)) break;
          *pos = *pos + 1;
        }
        if (bVar1 != 0x28) break;
        this_01 = (Bracket *)operator_new(0x40);
        Bracket(this_01,str,pos);
        local_50._M_dataplus._M_p = (pointer)this_01;
        std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::push_back
                  (this_00,(value_type *)&local_50);
        *pos = *pos + 1;
      }
      if (bVar1 == 0x29) break;
      this_02 = (Symbol *)operator_new(0x28);
      getWord(&local_50,str,pos);
      Symbol::Symbol(this_02,&local_50);
      local_58 = this_02;
      std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::push_back
                (this_00,(value_type *)&local_58);
    }
    return;
  }
  __assert_fail("str[pos] == \'(\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Final/src/Atom.cpp"
                ,0x21,"Bracket::Bracket(const std::string &, unsigned long &)");
}

Assistant:

Bracket::Bracket(const std::string &str, unsigned long &pos) {
    assert(str[pos] == '(');
    pos++;
    func = getWord(str, pos);
    Atom *temp;
    while (str[pos] != ')') {
        if (isBlank(str[pos])) {
            pos++;
        } else if (str[pos] == '(') {
            para.push_back(new Bracket(str, pos));
            pos++;
        } else {
            para.push_back(new Symbol(getWord(str, pos)));
        }
    }
}